

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_buffer.cc
# Opt level: O0

void __thiscall draco::EncoderBuffer::EndBitEncoding(EncoderBuffer *this)

{
  bool bVar1;
  pointer pBVar2;
  size_t sVar3;
  char *__src;
  EncoderBuffer *in_RDI;
  char *src;
  char *dst;
  uint32_t size_len;
  EncoderBuffer var_size_buffer;
  char *out_mem;
  uint64_t encoded_bytes;
  uint64_t encoded_bits;
  EncoderBuffer *in_stack_ffffffffffffff60;
  EncoderBuffer *this_00;
  unsigned_long in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff78;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  vector<char,_std::allocator<char>_> local_50 [2];
  EncoderBuffer *local_20;
  ulong local_18;
  uint64_t local_10;
  
  bVar1 = bit_encoder_active(in_RDI);
  if (bVar1) {
    pBVar2 = std::
             unique_ptr<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
             ::operator->((unique_ptr<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                           *)0x1855e8);
    local_10 = BitEncoder::Bits(pBVar2);
    local_18 = local_10 + 7 >> 3;
    pBVar2 = std::
             unique_ptr<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
             ::operator->((unique_ptr<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                           *)0x18561e);
    BitEncoder::Flush(pBVar2,0);
    if ((in_RDI->encode_bit_sequence_size_ & 1U) != 0) {
      in_stack_ffffffffffffff78 = data((EncoderBuffer *)0x185641);
      sVar3 = size((EncoderBuffer *)0x185650);
      local_20 = (EncoderBuffer *)
                 (in_stack_ffffffffffffff78 + (sVar3 - in_RDI->bit_encoder_reserved_bytes_) + -8);
      in_stack_ffffffffffffff80 = local_50;
      EncoderBuffer(in_stack_ffffffffffffff60);
      EncodeVarint<unsigned_long>(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      sVar3 = size((EncoderBuffer *)0x1856b0);
      memmove(&(local_20->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Tp_alloc_type + (sVar3 & 0xffffffff),
              &(local_20->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
              ,local_18);
      this_00 = local_20;
      __src = data((EncoderBuffer *)0x185713);
      memcpy(this_00,__src,sVar3 & 0xffffffff);
      in_RDI->bit_encoder_reserved_bytes_ =
           (8 - (sVar3 & 0xffffffff)) + in_RDI->bit_encoder_reserved_bytes_;
      ~EncoderBuffer(this_00);
    }
    std::vector<char,_std::allocator<char>_>::size(&in_RDI->buffer_);
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    in_RDI->bit_encoder_reserved_bytes_ = 0;
  }
  return;
}

Assistant:

void EncoderBuffer::EndBitEncoding() {
  if (!bit_encoder_active()) {
    return;
  }
  // Get the number of encoded bits and bytes (rounded up).
  const uint64_t encoded_bits = bit_encoder_->Bits();
  const uint64_t encoded_bytes = (encoded_bits + 7) / 8;
  // Flush all cached bits that are not in the bit encoder's main buffer.
  bit_encoder_->Flush(0);
  // Encode size if needed.
  if (encode_bit_sequence_size_) {
    char *out_mem = const_cast<char *>(data() + size());
    // Make the out_mem point to the memory reserved for storing the size.
    out_mem = out_mem - (bit_encoder_reserved_bytes_ + sizeof(uint64_t));

    EncoderBuffer var_size_buffer;
    EncodeVarint(encoded_bytes, &var_size_buffer);
    const uint32_t size_len = static_cast<uint32_t>(var_size_buffer.size());
    char *const dst = out_mem + size_len;
    const char *const src = out_mem + sizeof(uint64_t);
    memmove(dst, src, encoded_bytes);

    // Store the size of the encoded data.
    memcpy(out_mem, var_size_buffer.data(), size_len);

    // We need to account for the difference between the preallocated and actual
    // storage needed for storing the encoded length. This will be used later to
    // compute the correct size of |buffer_|.
    bit_encoder_reserved_bytes_ += sizeof(uint64_t) - size_len;
  }
  // Resize the underlying buffer to match the number of encoded bits.
  buffer_.resize(buffer_.size() - bit_encoder_reserved_bytes_ + encoded_bytes);
  bit_encoder_reserved_bytes_ = 0;
}